

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_socket(int domain,int protocol)

{
  int *piVar1;
  int rc;
  int protocol_local;
  int domain_local;
  
  nn_glock_lock();
  if ((self.flags & 1U) == 0) {
    nn_global_init();
    protocol_local = nn_global_create_socket(domain,protocol);
    if (protocol_local < 0) {
      nn_global_term();
      nn_glock_unlock();
      piVar1 = __errno_location();
      *piVar1 = -protocol_local;
      protocol_local = -1;
    }
    else {
      nn_glock_unlock();
    }
  }
  else {
    nn_glock_unlock();
    piVar1 = __errno_location();
    *piVar1 = 0x9523dfd;
    protocol_local = -1;
  }
  return protocol_local;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_glock_lock ();

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_ZOMBIE)) {
        nn_glock_unlock ();
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_glock_unlock ();
        errno = -rc;
        return -1;
    }

    nn_glock_unlock();

    return rc;
}